

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void __thiscall
duckdb::AggregateExecutor::
UnaryUpdate<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
          (AggregateExecutor *this,Vector *input,AggregateInputData *aggr_input_data,
          data_ptr_t state,idx_t count)

{
  undefined8 *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  hugeint_t lhs;
  hugeint_t lhs_00;
  hugeint_t lhs_01;
  hugeint_t rhs;
  hugeint_t rhs_00;
  hugeint_t rhs_01;
  hugeint_t rhs_02;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  hugeint_t hVar9;
  hugeint_t input_00;
  UnifiedVectorFormat idata;
  uint64_t in_stack_ffffffffffffff58;
  ulong in_stack_ffffffffffffff60;
  uint64_t in_stack_ffffffffffffff68;
  long lVar10;
  uint64_t uVar11;
  int64_t in_stack_ffffffffffffff70;
  AggregateExecutor *pAVar12;
  UnifiedVectorFormat local_78;
  
  if (*this == (AggregateExecutor)0x0) {
    lVar10 = *(long *)(this + 0x20);
    FlatVector::VerifyFlatVector((Vector *)this);
    if ((data_ptr_t)0x3f < state + 0x3f) {
      uVar11 = lVar10 + 8;
      uVar8 = 0;
      pdVar7 = (data_ptr_t)0x0;
      pAVar12 = this;
      do {
        if (*(long *)(this + 0x28) == 0) {
          pdVar5 = pdVar7 + 0x40;
          if (state <= pdVar7 + 0x40) {
            pdVar5 = state;
          }
LAB_00d42511:
          pdVar4 = pdVar7;
          if (pdVar7 < pdVar5) {
            *(undefined1 *)&(aggr_input_data->bind_data).ptr = 1;
            do {
              hVar9.upper = in_stack_ffffffffffffff60;
              hVar9.lower = in_stack_ffffffffffffff58;
              rhs_00.upper = (int64_t)pAVar12;
              rhs_00.lower = uVar11;
              hVar9 = Hugeint::Add<true>(hVar9,rhs_00);
              *(hugeint_t *)&aggr_input_data->allocator = hVar9;
              pdVar7 = pdVar7 + 1;
              this = pAVar12;
              pdVar4 = pdVar5;
            } while (pdVar5 != pdVar7);
          }
        }
        else {
          uVar2 = *(ulong *)(*(long *)(this + 0x28) + uVar8 * 8);
          pdVar5 = pdVar7 + 0x40;
          if (state <= pdVar7 + 0x40) {
            pdVar5 = state;
          }
          in_stack_ffffffffffffff60 = uVar8;
          if (uVar2 == 0xffffffffffffffff) goto LAB_00d42511;
          pdVar4 = pdVar5;
          if ((uVar2 != 0) && (this = pAVar12, pdVar4 = pdVar7, pdVar7 < pdVar5)) {
            uVar6 = 0;
            do {
              if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
                *(undefined1 *)&(aggr_input_data->bind_data).ptr = 1;
                lhs.upper = uVar8;
                lhs.lower = in_stack_ffffffffffffff58;
                rhs.upper = (int64_t)this;
                rhs.lower = uVar11;
                hVar9 = Hugeint::Add<true>(lhs,rhs);
                *(hugeint_t *)&aggr_input_data->allocator = hVar9;
              }
              uVar6 = uVar6 + 1;
              pdVar4 = pdVar5;
              in_stack_ffffffffffffff60 = uVar8;
              pAVar12 = this;
            } while ((long)pdVar5 - (long)pdVar7 != uVar6);
          }
        }
        pdVar7 = pdVar4;
        uVar8 = uVar8 + 1;
      } while (uVar8 != (ulong)(state + 0x3f) >> 6);
    }
  }
  else if (*this == (AggregateExecutor)0x2) {
    if ((*(byte **)(this + 0x28) == (byte *)0x0) || ((**(byte **)(this + 0x28) & 1) != 0)) {
      puVar1 = *(undefined8 **)(this + 0x20);
      *(undefined1 *)&(aggr_input_data->bind_data).ptr = 1;
      input_00.upper = (int64_t)state;
      input_00.lower = puVar1[1];
      HugeintAdd::AddConstant<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t>
                ((HugeintAdd *)aggr_input_data,(SumState<duckdb::hugeint_t> *)*puVar1,input_00,count
                );
      return;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat((Vector *)this,(idx_t)state,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (state != (data_ptr_t)0x0) {
        pdVar7 = (data_ptr_t)0x0;
        do {
          *(undefined1 *)&(aggr_input_data->bind_data).ptr = 1;
          lhs_01.upper = in_stack_ffffffffffffff60;
          lhs_01.lower = in_stack_ffffffffffffff58;
          rhs_02.upper = in_stack_ffffffffffffff70;
          rhs_02.lower = in_stack_ffffffffffffff68;
          hVar9 = Hugeint::Add<true>(lhs_01,rhs_02);
          *(hugeint_t *)&aggr_input_data->allocator = hVar9;
          pdVar7 = pdVar7 + 1;
        } while (state != pdVar7);
      }
    }
    else if (state != (data_ptr_t)0x0) {
      psVar3 = (local_78.sel)->sel_vector;
      pdVar7 = (data_ptr_t)0x0;
      do {
        pdVar5 = pdVar7;
        if (psVar3 != (sel_t *)0x0) {
          pdVar5 = (data_ptr_t)(ulong)psVar3[(long)pdVar7];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)pdVar5 >> 6] >> ((ulong)pdVar5 & 0x3f) & 1) != 0)) {
          *(undefined1 *)&(aggr_input_data->bind_data).ptr = 1;
          lhs_00.upper = in_stack_ffffffffffffff60;
          lhs_00.lower = in_stack_ffffffffffffff58;
          rhs_01.upper = in_stack_ffffffffffffff70;
          rhs_01.lower = in_stack_ffffffffffffff68;
          hVar9 = Hugeint::Add<true>(lhs_00,rhs_01);
          *(hugeint_t *)&aggr_input_data->allocator = hVar9;
        }
        pdVar7 = pdVar7 + 1;
      } while (state != pdVar7);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}